

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

ParseNodePtr __thiscall Parser::ParseImport<false>(Parser *this)

{
  Scanner_t *this_00;
  tokens tVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t ichMin;
  undefined4 *puVar4;
  ParseNodePtr pPVar5;
  Parser *this_01;
  undefined1 auStack_78 [8];
  RestorePoint parsedImport;
  SListNodeBase<Memory::ArenaAllocator> SStack_38;
  BOOL fCanAssign;
  IdentToken token;
  
  if (((this->m_scriptContext->config).threadConfig)->m_ES6Module == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0xac7,"(m_scriptContext->GetConfig()->IsES6ModuleEnabled())",
                       "m_scriptContext->GetConfig()->IsES6ModuleEnabled()");
    if (!bVar3) goto LAB_00cf6b14;
    *puVar4 = 0;
  }
  if ((this->m_token).tk != tkIMPORT) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0xac8,"(m_token.tk == tkIMPORT)","m_token.tk == tkIMPORT");
    if (!bVar3) {
LAB_00cf6b14:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this_00 = &this->m_scan;
  ichMin = Scanner<UTF8EncodingPolicyBase<false>_>::IchMinTok(this_00);
  parsedImport.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
  parsedImport.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
  parsedImport.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
  auStack_78._0_4_ = 0xffffffff;
  auStack_78._4_4_ = 0xffffffff;
  parsedImport.m_ichMinTok = 0xffffffff;
  parsedImport.m_ichMinLine = 0xffffffff;
  parsedImport._20_16_ = (undefined1  [16])0x0;
  parsedImport.m_fHadEol = -1;
  parsedImport._44_4_ = 0xffffffff;
  Scanner<UTF8EncodingPolicyBase<false>_>::Capture(this_00,(RestorePoint *)auStack_78);
  this_01 = (Parser *)this_00;
  Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  tVar1 = (this->m_token).tk;
  if (tVar1 == tkDot) {
    if (((this->m_scriptContext->config).threadConfig)->m_ESImportMeta == true) {
      ParseMetaProperty<false>(this,tkIMPORT,ichMin,(BOOL *)&stack0xffffffffffffffc8);
      Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(this_00,(RestorePoint *)auStack_78);
      pPVar5 = ParseExpr<false>(this,0,(BOOL *)0x0,1,0,(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0,
                                (IdentToken *)0x0,false,(bool *)0x0,(charcount_t *)0x0,(bool *)0x0);
      return pPVar5;
    }
  }
  else if (tVar1 == tkLParen) {
    if (((this->m_scriptContext->config).threadConfig)->m_ESDynamicImport != false) {
      pPVar5 = ParseImportCall<false>(this);
      SStack_38.next = (Type)((ulong)(uint)fCanAssign << 0x20);
      token.tk = tkNone;
      token._4_4_ = 0;
      pPVar5 = ParsePostfixOperators<false>
                         (this,pPVar5,1,0,0,1,(BOOL *)((long)&parsedImport.m_cMultiUnits + 4),
                          (IdentToken *)&stack0xffffffffffffffc8,(bool *)0x0);
      return pPVar5;
    }
    Error(this_01,-0x7ff5fbb7,L"",L"");
  }
  Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(this_00,(RestorePoint *)auStack_78);
  CheckIfImportOrExportStatementValidHere(this);
  Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  if ((this->m_token).tk == tkStrCon) {
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  }
  else {
    SStack_38.next = &stack0xffffffffffffffc8;
    token._0_8_ = (ulong)(uint)token._4_4_ << 0x20;
    token.pid = (IdentPtr)this;
    ParseImportClause<false>(this,(ModuleImportOrExportEntryList *)SStack_38.next,false);
    ParseImportOrExportFromClause<false>(this,true);
    SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::Clear
              ((SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
               &stack0xffffffffffffffc8);
    SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::~SList
              ((SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
               &stack0xffffffffffffffc8);
  }
  return (ParseNodePtr)0x0;
}

Assistant:

ParseNodePtr Parser::ParseImport()
{
    Assert(m_scriptContext->GetConfig()->IsES6ModuleEnabled());
    Assert(m_token.tk == tkIMPORT);

    charcount_t ichMin = this->GetScanner()->IchMinTok();
    RestorePoint parsedImport;
    this->GetScanner()->Capture(&parsedImport);
    this->GetScanner()->Scan();

    // import()
    if (m_token.tk == tkLParen)
    {
        if (!m_scriptContext->GetConfig()->IsESDynamicImportEnabled())
        {
            Error(ERRExperimental);
        }

        ParseNodePtr pnode = ParseImportCall<buildAST>();
        BOOL fCanAssign;
        IdentToken token;
        return ParsePostfixOperators<buildAST>(pnode, TRUE, FALSE, FALSE, TRUE, &fCanAssign, &token);
    }
    else if (m_token.tk == tkDot && m_scriptContext->GetConfig()->IsESImportMetaEnabled())
    {
        BOOL fCanAssign;
        ParseMetaProperty<buildAST>(tkIMPORT, ichMin, &fCanAssign);
        this->GetScanner()->SeekTo(parsedImport);
        return ParseExpr<buildAST>();
    }

    this->GetScanner()->SeekTo(parsedImport);

    CheckIfImportOrExportStatementValidHere();

    // We just parsed an import token. Next valid token is *, {, string constant, or binding identifier.
    this->GetScanner()->Scan();

    if (m_token.tk == tkStrCon)
    {
        // This import declaration has no import clause.
        // "import ModuleSpecifier;"
        if (buildAST)
        {
            AddModuleSpecifier(m_token.GetStr());
        }

        // Scan past the module identifier.
        this->GetScanner()->Scan();
    }
    else
    {
        ModuleImportOrExportEntryList importEntryList(&m_nodeAllocator);

        // Parse the import clause (default binding can only exist before the comma).
        ParseImportClause<buildAST>(&importEntryList);

        // Token following import clause must be the identifier 'from'
        IdentPtr moduleSpecifier = ParseImportOrExportFromClause<buildAST>(true);

        if (buildAST)
        {
            Assert(moduleSpecifier != nullptr);

            AddModuleSpecifier(moduleSpecifier);

            importEntryList.Map([this, moduleSpecifier](ModuleImportOrExportEntry& importEntry) {
                importEntry.moduleRequest = moduleSpecifier;
                AddModuleImportOrExportEntry(EnsureModuleImportEntryList(), &importEntry);
            });
        }

        importEntryList.Clear();
    }

    // Import statement is actually a nop, we hoist all the imported bindings to the top of the module.
    return nullptr;
}